

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::FromVectorToUnknowns
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector)

{
  double dVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  pointer ppCVar5;
  ChVariables *pCVar6;
  ChConstraint *pCVar7;
  int iVar8;
  int n;
  CoeffReturnType pdVar9;
  size_t iv;
  long lVar10;
  size_t ic;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChVectorRef local_80;
  Type local_68;
  
  iVar8 = (*this->_vptr_ChSystemDescriptor[7])();
  this->n_q = iVar8;
  iVar8 = (*this->_vptr_ChSystemDescriptor[8])(this);
  this->n_c = iVar8;
  if ((mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)iVar8 + (long)this->n_q) {
    ppCVar2 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppCVar3 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppCVar4 = (this->vvariables).
              super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar5 = (this->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (lVar10 = 0; (long)ppCVar2 - (long)ppCVar4 >> 3 != lVar10; lVar10 = lVar10 + 1) {
      pCVar6 = (this->vvariables).
               super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10];
      if (pCVar6->disabled == false) {
        iVar8 = pCVar6->offset;
        n = (*pCVar6->_vptr_ChVariables[2])();
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                  (&local_68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)mvector,
                   (long)iVar8,n);
        ChVariables::Get_qb(&local_80,
                            (this->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar10]);
        Eigen::internal::
        call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                  (&local_80,
                   &local_68.super_Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>
                  );
      }
    }
    for (lVar10 = 0; (long)ppCVar3 - (long)ppCVar5 >> 3 != lVar10; lVar10 = lVar10 + 1) {
      pCVar7 = (this->vconstraints).
               super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10];
      if (pCVar7->active == true) {
        pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)mvector,
                            (long)this->n_q + (long)pCVar7->offset);
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *pdVar9;
        auVar11._8_8_ = 0x8000000000000000;
        auVar11._0_8_ = 0x8000000000000000;
        auVar11 = vxorpd_avx512vl(auVar12,auVar11);
        dVar1 = (double)vmovlpd_avx(auVar11);
        pCVar7->l_i = dVar1;
      }
    }
    return this->n_c + this->n_q;
  }
  __assert_fail("(n_q + n_c) == mvector.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChSystemDescriptor.cpp"
                ,0x1ce,
                "virtual int chrono::ChSystemDescriptor::FromVectorToUnknowns(const ChVectorDynamic<> &)"
               );
}

Assistant:

int ChSystemDescriptor::FromVectorToUnknowns(const ChVectorDynamic<>& mvector) {
    n_q = CountActiveVariables();
    n_c = CountActiveConstraints();

    assert((n_q + n_c) == mvector.size());

    auto vv_size = vvariables.size();
    auto vc_size = vconstraints.size();

    // Fetch from the first part of vector (x.q = q)
    for (size_t iv = 0; iv < vv_size; iv++) {
        if (vvariables[iv]->IsActive()) {
            vvariables[iv]->Get_qb() = mvector.segment(vvariables[iv]->GetOffset(), vvariables[iv]->Get_ndof());
        }
    }

    // Fetch from the second part of vector (x.l = -l), with flipped sign!
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            vconstraints[ic]->Set_l_i(-mvector(vconstraints[ic]->GetOffset() + n_q));
        }
    }

    return n_q + n_c;
}